

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_info(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  DAngle *angle;
  char *pcVar2;
  DAngle DVar3;
  DAngle DVar4;
  bool bVar5;
  uint uVar6;
  PClass *pPVar7;
  FTranslatedLineTarget t;
  undefined1 local_48 [24];
  DAngle local_30 [3];
  
  bVar5 = CheckCheatmode(true);
  if ((!bVar5) && (angle = (DAngle *)(&players)[(long)consoleplayer * 0x54], angle != (DAngle *)0x0)
     ) {
    local_48._16_8_ = angle[0x12].Degrees;
    local_48._8_8_ = (PClass *)0x0;
    DVar3 = P_AimLineAttack((AActor *)local_48,angle,2048.0,
                            (FTranslatedLineTarget *)(local_48 + 0x10),local_30,(int)local_48 + 8,
                            (AActor *)0x5,(AActor *)0x0);
    DVar4.Degrees = local_30[0].Degrees;
    if ((AActor *)local_30[0].Degrees == (AActor *)0x0) {
      Printf("No target found. Info cannot find actors that have the NOBLOCKMAP flag or have height/radius of 0.\n"
             ,SUB84(DVar3.Degrees,0));
    }
    else {
      pPVar7 = *(PClass **)((long)local_30[0].Degrees + 8);
      if (pPVar7 == (PClass *)0x0) {
        pPVar7 = (PClass *)(*(code *)**(undefined8 **)local_30[0].Degrees)(local_30[0].Degrees);
        *(PClass **)((long)DVar4.Degrees + 8) = pPVar7;
      }
      pcVar2 = FName::NameData.NameArray[(pPVar7->super_PStruct).super_PNamedType.TypeName.Index].
               Text;
      uVar1 = *(int *)((long)local_30[0].Degrees + 0x1cc);
      uVar6 = AActor::SpawnHealth((AActor *)local_30[0].Degrees);
      Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar2,(ulong)uVar1,(ulong)uVar6);
      PrintMiscActorInfo((AActor *)local_30[0].Degrees);
    }
  }
  return;
}

Assistant:

CCMD(info)
{
	FTranslatedLineTarget t;

	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	P_AimLineAttack(players[consoleplayer].mo,players[consoleplayer].mo->Angles.Yaw, MISSILERANGE,
		&t, 0.,	ALF_CHECKNONSHOOTABLE|ALF_FORCENOSMART);
	if (t.linetarget)
	{
		Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
			t.linetarget->GetClass()->TypeName.GetChars(),
			t.linetarget->health,
			t.linetarget->SpawnHealth());
		PrintMiscActorInfo(t.linetarget);
	}
	else Printf("No target found. Info cannot find actors that have "
				"the NOBLOCKMAP flag or have height/radius of 0.\n");
}